

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O2

UBool icu_63::enumGroupNames
                (UCharNames *names,uint16_t *group,UChar32 start,UChar32 end,UEnumCharNamesFn *fn,
                void *context,UCharNameChoice nameChoice)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  byte *pbVar4;
  UBool UVar5;
  uint16_t uVar6;
  uint8_t *puVar7;
  ulong uVar8;
  byte *pbVar9;
  short sVar10;
  short sVar11;
  byte *pbVar12;
  byte *pbVar13;
  UCharNameChoice UVar14;
  byte *pbVar15;
  ushort uVar16;
  uint uVar17;
  bool bVar18;
  uint16_t lengths [34];
  uint16_t offsets [34];
  char buffer [200];
  uint16_t local_198 [40];
  uint16_t local_148 [40];
  char local_f8 [200];
  
  puVar7 = expandGroupLengths((uint8_t *)
                              ((long)&names->tokenStringOffset +
                              ((long)(int)((uint)group[1] << 0x10) | (ulong)group[2]) +
                              (ulong)names->groupStringOffset),local_148,local_198);
  if (fn == (UEnumCharNamesFn *)0x0) {
    pbVar4 = *context;
    for (; start <= end; start = start + 1) {
      uVar8 = (ulong)((start & 0x1fU) * 2);
      pbVar9 = puVar7 + *(ushort *)((long)local_148 + uVar8);
      sVar10 = *(short *)((long)local_198 + uVar8);
      uVar3 = (ushort)names[1].tokenStringOffset;
      if ((nameChoice & ~U_EXTENDED_CHAR_NAME) != U_UNICODE_CHAR_NAME) {
        UVar14 = nameChoice;
        if ((uVar3 < 0x3c) || ((short)names[8].groupStringOffset == -1)) {
          do {
            sVar11 = sVar10;
            if (sVar10 == 0) {
              sVar10 = 0;
            }
            else {
              do {
                sVar10 = sVar11 + -1;
                bVar1 = *pbVar9;
                pbVar9 = pbVar9 + 1;
                if (bVar1 == 0x3b) break;
                bVar18 = sVar11 != 1;
                sVar11 = sVar10;
              } while (bVar18);
            }
            bVar18 = 1 < (int)UVar14;
            UVar14 = UVar14 - U_UNICODE_10_CHAR_NAME;
          } while (bVar18);
        }
        else {
          sVar10 = 0;
        }
      }
      pbVar12 = pbVar4;
LAB_002d2b4d:
      do {
        pbVar15 = pbVar9;
LAB_002d2b65:
        pbVar13 = pbVar12;
        if (sVar10 == 0) goto LAB_002d2c17;
        pbVar9 = pbVar15 + 1;
        uVar16 = (ushort)*pbVar15;
        uVar17 = (uint)uVar16;
        if (uVar16 < uVar3) {
          uVar16 = *(ushort *)((long)&names[1].tokenStringOffset + (ulong)uVar16 * 2 + 2);
          sVar11 = sVar10 + -1;
          if (uVar16 == 0xfffe) {
            pbVar9 = pbVar15 + 2;
            uVar16 = *(ushort *)
                      ((long)&names[1].tokenStringOffset +
                      (ulong)(uVar17 * 0x200 + (uint)pbVar15[1] * 2) + 2);
            sVar11 = sVar10 + -2;
          }
          sVar10 = sVar11;
          if (uVar16 != 0xffff) {
            pbVar15 = (byte *)((long)&names->tokenStringOffset +
                              (ulong)uVar16 + (ulong)names->tokenStringOffset);
            goto LAB_002d2bf7;
          }
          if (uVar17 == 0x3b) goto code_r0x002d2bc0;
        }
        else {
          sVar10 = sVar10 + -1;
          if (uVar17 == 0x3b) goto LAB_002d2c17;
        }
        bVar1 = *pbVar12;
        pbVar12 = pbVar12 + 1;
      } while (*pbVar15 == bVar1);
LAB_002d2c1c:
    }
  }
  else {
    for (; start <= end; start = start + 1) {
      uVar8 = (ulong)((start & 0x1fU) * 2);
      uVar6 = expandName(names,puVar7 + *(ushort *)((long)local_148 + uVar8),
                         *(uint16_t *)((long)local_198 + uVar8),nameChoice,local_f8,200);
      if ((nameChoice == U_EXTENDED_CHAR_NAME) && (uVar6 == 0)) {
        uVar6 = getExtName(start,local_f8,200);
        local_f8[uVar6] = '\0';
      }
      if ((uVar6 != 0) &&
         (UVar5 = (*fn)(context,start,nameChoice,local_f8,(int32_t)uVar6), UVar5 == '\0')) {
        return '\0';
      }
    }
  }
  return '\x01';
LAB_002d2bf7:
  bVar1 = *pbVar15;
  if (bVar1 == 0) goto LAB_002d2b4d;
  pbVar15 = pbVar15 + 1;
  bVar2 = *pbVar12;
  pbVar12 = pbVar12 + 1;
  if (bVar1 != bVar2) goto LAB_002d2c1c;
  goto LAB_002d2bf7;
code_r0x002d2bc0:
  if ((pbVar12 != pbVar4 || nameChoice != U_EXTENDED_CHAR_NAME) ||
     (pbVar15 = pbVar9, pbVar13 = pbVar4, (short)names[8].groupStringOffset != -1)) {
LAB_002d2c17:
    if (*pbVar13 == 0) {
      *(UChar32 *)((long)context + 8) = start;
      return '\0';
    }
    goto LAB_002d2c1c;
  }
  goto LAB_002d2b65;
}

Assistant:

static UBool
enumGroupNames(UCharNames *names, const uint16_t *group,
               UChar32 start, UChar32 end,
               UEnumCharNamesFn *fn, void *context,
               UCharNameChoice nameChoice) {
    uint16_t offsets[LINES_PER_GROUP+2], lengths[LINES_PER_GROUP+2];
    const uint8_t *s=(uint8_t *)names+names->groupStringOffset+GET_GROUP_OFFSET(group);

    s=expandGroupLengths(s, offsets, lengths);
    if(fn!=DO_FIND_NAME) {
        char buffer[200];
        uint16_t length;

        while(start<=end) {
            length=expandName(names, s+offsets[start&GROUP_MASK], lengths[start&GROUP_MASK], nameChoice, buffer, sizeof(buffer));
            if (!length && nameChoice == U_EXTENDED_CHAR_NAME) {
                buffer[length = getExtName(start, buffer, sizeof(buffer))] = 0;
            }
            /* here, we assume that the buffer is large enough */
            if(length>0) {
                if(!fn(context, start, nameChoice, buffer, length)) {
                    return FALSE;
                }
            }
            ++start;
        }
    } else {
        const char *otherName=((FindName *)context)->otherName;
        while(start<=end) {
            if(compareName(names, s+offsets[start&GROUP_MASK], lengths[start&GROUP_MASK], nameChoice, otherName)) {
                ((FindName *)context)->code=start;
                return FALSE;
            }
            ++start;
        }
    }
    return TRUE;
}